

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::AddSub
          (TPZMatrix<std::complex<long_double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,
          int64_t colSize,int64_t pRow,int64_t pCol,TPZMatrix<std::complex<long_double>_> *pA)

{
  int64_t iVar1;
  long lVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  complex<long_double> *in_R9;
  long in_stack_00000008;
  TPZBaseMatrix *in_stack_00000010;
  int64_t c;
  int64_t col;
  int64_t r;
  int64_t row;
  int64_t NewColSize;
  int64_t NewRowSize;
  char *in_stack_00000110;
  TPZBaseMatrix *__y;
  complex<long_double> *__x;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [40];
  long local_60;
  long local_58;
  complex<long_double> *local_50;
  long local_48;
  long local_40;
  undefined1 *local_38;
  complex<long_double> *local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = TPZBaseMatrix::Rows(in_stack_00000010);
  if ((long)(in_R9->_M_value + in_RCX) <= iVar1) {
    lVar2 = in_stack_00000008 + local_28;
    iVar1 = TPZBaseMatrix::Cols(in_stack_00000010);
    if (lVar2 <= iVar1) goto LAB_012c03f2;
  }
  Error(in_stack_00000110,(char *)pA);
LAB_012c03f2:
  local_38 = local_30->_M_value + local_20;
  local_40 = local_28 + in_stack_00000008;
  local_48 = local_10;
  for (local_50 = local_30; (long)local_50 < (long)local_38;
      local_50 = (complex<long_double> *)(local_50->_M_value + 1)) {
    local_58 = local_18;
    for (local_60 = in_stack_00000008; lVar2 = local_60, local_60 < local_40;
        local_60 = local_60 + 1) {
      __y = in_stack_00000010;
      __x = local_50;
      (**(code **)(*in_RDI + 0x120))(local_a8,in_RDI,local_48,local_58);
      (*(in_stack_00000010->super_TPZSavable)._vptr_TPZSavable[0x24])
                (local_c8,in_stack_00000010,local_50,local_60);
      std::operator+(__x,(complex<long_double> *)__y);
      (*(__y->super_TPZSavable)._vptr_TPZSavable[0x23])(__y,__x,lVar2,local_88);
      local_58 = local_58 + 1;
    }
    local_48 = local_48 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow, const int64_t sCol, const int64_t rowSize,
							const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        Error( "AddSub <the sub-matrix is too big that target>" );
    }
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col )+pA->GetVal(r,c));
        }
    }
    return( 1 );
}